

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

MRIStepCoupling MRIStepCoupling_Alloc(int nmat,int stages,MRISTEP_METHOD_TYPE type)

{
  realtype ***ppprVar1;
  MRIStepCoupling MRIC;
  realtype *prVar2;
  realtype ***ppprVar3;
  realtype **pprVar4;
  ulong uVar5;
  ulong uVar6;
  ulong __nmemb;
  ulong __nmemb_00;
  
  if ((0 < stages && 0 < nmat) &&
     (MRIC = (MRIStepCoupling)malloc(0x28), MRIC != (MRIStepCoupling)0x0)) {
    MRIC->nmat = nmat;
    MRIC->stages = stages;
    __nmemb = (ulong)(uint)stages;
    prVar2 = (realtype *)calloc(__nmemb,8);
    MRIC->q = 0;
    MRIC->p = 0;
    MRIC->c = (realtype *)0x0;
    MRIC->W = (realtype ***)0x0;
    MRIC->G = (realtype ***)0x0;
    MRIC->c = prVar2;
    if (prVar2 != (realtype *)0x0) {
      __nmemb_00 = (ulong)(uint)nmat;
      if ((type & ~MRISTEP_IMEX) == MRISTEP_EXPLICIT) {
        ppprVar3 = (realtype ***)calloc(__nmemb_00,8);
        MRIC->W = ppprVar3;
        if (ppprVar3 != (realtype ***)0x0) {
          uVar6 = 0;
LAB_004c4d43:
          if (__nmemb_00 != uVar6) goto code_r0x004c4d48;
          for (uVar6 = 0; uVar6 != __nmemb_00; uVar6 = uVar6 + 1) {
            uVar5 = 0;
            while (__nmemb != uVar5) {
              ppprVar3[uVar6][uVar5] = (realtype *)0x0;
              prVar2 = (realtype *)calloc(__nmemb,8);
              MRIC->W[uVar6][uVar5] = prVar2;
              ppprVar3 = MRIC->W;
              pprVar4 = ppprVar3[uVar6] + uVar5;
              uVar5 = uVar5 + 1;
              if (*pprVar4 == (realtype *)0x0) goto LAB_004c4d6f;
            }
          }
          goto LAB_004c4ccc;
        }
      }
      else {
LAB_004c4ccc:
        if (1 < type - MRISTEP_IMPLICIT) {
          return MRIC;
        }
        ppprVar3 = (realtype ***)calloc(__nmemb_00,8);
        MRIC->G = ppprVar3;
        if (ppprVar3 != (realtype ***)0x0) {
          uVar6 = 0;
          do {
            if (__nmemb_00 == uVar6) {
              uVar6 = 0;
              do {
                if (uVar6 == __nmemb_00) {
                  return MRIC;
                }
                uVar5 = 0;
                while (__nmemb != uVar5) {
                  ppprVar3[uVar6][uVar5] = (realtype *)0x0;
                  prVar2 = (realtype *)calloc(__nmemb,8);
                  MRIC->G[uVar6][uVar5] = prVar2;
                  ppprVar3 = MRIC->G;
                  pprVar4 = ppprVar3[uVar6] + uVar5;
                  uVar5 = uVar5 + 1;
                  if (*pprVar4 == (realtype *)0x0) goto LAB_004c4d6f;
                }
                uVar6 = uVar6 + 1;
              } while( true );
            }
            ppprVar3[uVar6] = (realtype **)0x0;
            pprVar4 = (realtype **)calloc(__nmemb,8);
            MRIC->G[uVar6] = pprVar4;
            ppprVar3 = MRIC->G;
            ppprVar1 = ppprVar3 + uVar6;
            uVar6 = uVar6 + 1;
          } while (*ppprVar1 != (realtype **)0x0);
        }
      }
    }
LAB_004c4d6f:
    MRIStepCoupling_Free(MRIC);
  }
  return (MRIStepCoupling)0x0;
code_r0x004c4d48:
  ppprVar3[uVar6] = (realtype **)0x0;
  pprVar4 = (realtype **)calloc(__nmemb,8);
  MRIC->W[uVar6] = pprVar4;
  ppprVar3 = MRIC->W;
  ppprVar1 = ppprVar3 + uVar6;
  uVar6 = uVar6 + 1;
  if (*ppprVar1 == (realtype **)0x0) goto LAB_004c4d6f;
  goto LAB_004c4d43;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Alloc(int nmat, int stages,
                                      MRISTEP_METHOD_TYPE type)
{
  int i, j;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal input values */
  if (nmat < 1 || stages < 1) return(NULL);

  /* ------------------------------------------
   * Allocate and initialize coupling structure
   * ------------------------------------------ */

  MRIC = (MRIStepCoupling) malloc(sizeof(struct MRIStepCouplingMem));
  if (!MRIC) return(NULL);

  MRIC->nmat   = nmat;
  MRIC->stages = stages;
  MRIC->q      = 0;
  MRIC->p      = 0;
  MRIC->c      = NULL;
  MRIC->W      = NULL;
  MRIC->G      = NULL;

  /* --------------------------------------------
   * Allocate abscissae and coupling coefficients
   * -------------------------------------------- */

  MRIC->c = (realtype *) calloc( stages, sizeof(realtype) );
  if (!(MRIC->c)) { MRIStepCoupling_Free(MRIC); return(NULL); }

  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX) {

    /* allocate W matrices */
    MRIC->W = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->W)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in W */
    for (i=0; i<nmat; i++) {
      MRIC->W[i] = NULL;
      MRIC->W[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->W[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in W */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->W[i][j] = NULL;
        MRIC->W[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->W[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX) {

    /* allocate G matrices */
    MRIC->G = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->G)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in G */
    for (i=0; i<nmat; i++) {
      MRIC->G[i] = NULL;
      MRIC->G[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->G[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in G */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->G[i][j] = NULL;
        MRIC->G[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->G[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  return(MRIC);
}